

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetImplicit(void *arkode_mem)

{
  int iVar1;
  sunrealtype in_RDI;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  ARKodeMem in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = arkStep_AccessARKODEStepMem
                    (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                     (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (ARKodeARKStepMem *)0x11ee74);
  if (iVar1 == 0) {
    if (*(long *)(in_stack_ffffffffffffffe0 + 8) == 0) {
      arkProcessError(in_stack_ffffffffffffffe8,-0x16,0x53,"ARKStepSetImplicit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                      ,
                      "Cannot specify that method is implicit without providing a function pointer to fi(t,y)."
                     );
      iVar1 = -0x16;
    }
    else {
      in_stack_ffffffffffffffe0[0x20] = '\x01';
      in_stack_ffffffffffffffe0[0x21] = '\0';
      in_stack_ffffffffffffffe0[0x22] = '\0';
      in_stack_ffffffffffffffe0[0x23] = '\0';
      in_stack_ffffffffffffffe0[0x1c] = '\0';
      in_stack_ffffffffffffffe0[0x1d] = '\0';
      in_stack_ffffffffffffffe0[0x1e] = '\0';
      in_stack_ffffffffffffffe0[0x1f] = '\0';
      if (in_stack_ffffffffffffffe8->user_efun == 0) {
        if ((in_stack_ffffffffffffffe8->itol == 1) &&
           (in_stack_ffffffffffffffe8->Vabstol != (N_Vector)0x0)) {
          iVar1 = ARKodeSVtolerances((void *)CONCAT44(in_stack_fffffffffffffffc,
                                                      in_stack_fffffffffffffff8),in_RDI,
                                     (N_Vector)in_stack_ffffffffffffffe8);
        }
        else {
          iVar1 = ARKodeSStolerances(in_stack_ffffffffffffffe8,
                                     (sunrealtype)in_stack_ffffffffffffffe0,
                                     (sunrealtype)(ulong)in_stack_ffffffffffffffd8);
        }
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKStepSetImplicit(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* ensure that fi is defined */
  if (step_mem->fi == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_MISSING_FI);
    return (ARK_ILL_INPUT);
  }

  /* set the relevant parameters */
  step_mem->implicit = SUNTRUE;
  step_mem->explicit = SUNFALSE;

  /* re-attach internal error weight functions if necessary */
  if (!ark_mem->user_efun)
  {
    if (ark_mem->itol == ARK_SV && ark_mem->Vabstol != NULL)
    {
      retval = ARKodeSVtolerances(ark_mem, ark_mem->reltol, ark_mem->Vabstol);
    }
    else
    {
      retval = ARKodeSStolerances(ark_mem, ark_mem->reltol, ark_mem->Sabstol);
    }
    if (retval != ARK_SUCCESS) { return (retval); }
  }

  return (ARK_SUCCESS);
}